

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

void __thiscall QFileSystemModelPrivate::rebuildNameFilterRegexps(QFileSystemModelPrivate *this)

{
  vector<QRegularExpression,_std::allocator<QRegularExpression>_> *this_00;
  uint uVar1;
  long lVar2;
  QString *pQVar3;
  long in_FS_OFFSET;
  QRegularExpression QStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->nameFiltersRegexps;
  std::vector<QRegularExpression,_std::allocator<QRegularExpression>_>::clear(this_00);
  std::vector<QRegularExpression,_std::allocator<QRegularExpression>_>::reserve
            (this_00,(this->nameFilters).d.size);
  uVar1 = (this->filters).super_QFlagsStorageHelper<QDir::Filter,_4>.
          super_QFlagsStorage<QDir::Filter>.i;
  pQVar3 = (this->nameFilters).d.ptr;
  for (lVar2 = (this->nameFilters).d.size * 0x18; lVar2 != 0; lVar2 = lVar2 + -0x18) {
    QRegularExpression::fromWildcard(&QStack_38,(pQVar3->d).size,(pQVar3->d).ptr,uVar1 >> 0xb & 1,0)
    ;
    std::vector<QRegularExpression,_std::allocator<QRegularExpression>_>::
    emplace_back<QRegularExpression>(this_00,&QStack_38);
    QRegularExpression::~QRegularExpression(&QStack_38);
    pQVar3 = pQVar3 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileSystemModelPrivate::rebuildNameFilterRegexps()
{
    nameFiltersRegexps.clear();
    nameFiltersRegexps.reserve(nameFilters.size());
    const auto cs = (filters & QDir::CaseSensitive) ? Qt::CaseSensitive : Qt::CaseInsensitive;
    const auto convertWildcardToRegexp = [cs](const QString &nameFilter)
    {
        return QRegularExpression::fromWildcard(nameFilter, cs);
    };
    std::transform(nameFilters.constBegin(),
                   nameFilters.constEnd(),
                   std::back_inserter(nameFiltersRegexps),
                   convertWildcardToRegexp);
}